

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_WasmPrintFunc(InterpreterStackFrame *this,int regIndex)

{
  uint index;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  AsmJsFunctionInfo *pAVar5;
  WasmFunctionInfo *pWVar6;
  FunctionProxy *this_00;
  
  this_00 = *(FunctionProxy **)(this + 0x88);
  if ((this_00->field_0x46 & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2578,"(m_functionBody->IsWasmFunction())",
                                "m_functionBody->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    this_00 = *(FunctionProxy **)(this + 0x88);
  }
  index = *(uint *)(*(long *)(this + 0x118) + (long)regIndex * 4);
  pAVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                     (this_00);
  pWVar6 = WebAssemblyModule::GetWasmFunctionInfo((pAVar5->mWasmModule).ptr,index);
  uVar3 = WAsmJs::Tracing::GetPrintCol();
  if (0 < (int)uVar3) {
    Output::SkipToColumn((ulong)uVar3);
  }
  FunctionBody::DumpFullFunctionName((pWVar6->m_body).ptr);
  Output::Print(L"(");
  return;
}

Assistant:

void InterpreterStackFrame::OP_WasmPrintFunc(int regIndex)
    {
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && defined(ENABLE_WASM)
        Assert(m_functionBody->IsWasmFunction());
        uint index = GetRegRawInt(regIndex);
        Wasm::WasmFunctionInfo* info = m_functionBody->GetAsmJsFunctionInfo()->GetWebAssemblyModule()->GetWasmFunctionInfo(index);
        int col = WAsmJs::Tracing::GetPrintCol();
        if (col > 0)
        {
            Output::SkipToColumn(col);
        }
        info->GetBody()->DumpFullFunctionName();
        Output::Print(_u("("));
#endif
    }